

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O1

string * __thiscall
InstructionAtom::get_sym_abi_cxx11_(string *__return_storage_ptr__,InstructionAtom *this)

{
  pointer pcVar1;
  
  if (this->kind == IMM_SYM) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->sym)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->sym)._M_string_length);
    return __return_storage_ptr__;
  }
  __assert_fail("kind == IMM_SYM",
                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Disasm/Instruction.cpp"
                ,0x6b,"std::string InstructionAtom::get_sym() const");
}

Assistant:

std::string InstructionAtom::get_sym() const {
  assert(kind == IMM_SYM);
  return sym;
}